

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O3

bool absl::lts_20240722::debugging_internal::ParseOperatorName(State *state,int *arity)

{
  ParseState *pPVar1;
  undefined1 *puVar2;
  byte bVar3;
  char cVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  int iVar10;
  int iVar11;
  undefined4 uVar12;
  bool bVar13;
  bool bVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  char *pcVar18;
  char *str;
  char *pcVar19;
  undefined8 *puVar20;
  
  iVar16 = state->recursion_depth;
  iVar15 = state->steps;
  state->recursion_depth = iVar16 + 1;
  state->steps = iVar15 + 1;
  if (iVar15 < 0x20000 && iVar16 < 0x100) {
    lVar17 = (long)(state->parse_state).mangled_idx;
    if ((state->mangled_begin[lVar17] != '\0') && (state->mangled_begin[lVar17 + 1] != '\0')) {
      pPVar1 = &state->parse_state;
      iVar16 = (state->parse_state).prev_name_idx;
      uVar8 = pPVar1->mangled_idx;
      uVar9 = pPVar1->out_cur_idx;
      uVar5 = *(uint *)&(state->parse_state).field_0xc;
      bVar13 = ParseTwoCharToken(state,"cv");
      if (bVar13) {
        MaybeAppend(state,"operator ");
        puVar2 = &(state->parse_state).field_0xc;
        *(uint *)puVar2 = *(uint *)puVar2 & 0x8000ffff;
        iVar15 = state->recursion_depth;
        iVar6 = state->steps;
        state->recursion_depth = iVar15 + 1;
        state->steps = iVar6 + 1;
        if (0x1ffff < iVar6 || 0xff < iVar15) {
LAB_00105113:
          state->recursion_depth = iVar15;
          goto LAB_00105116;
        }
        iVar6 = pPVar1->mangled_idx;
        iVar10 = pPVar1->out_cur_idx;
        iVar11 = (state->parse_state).prev_name_idx;
        uVar12 = *(undefined4 *)&(state->parse_state).field_0xc;
        pcVar18 = state->mangled_begin;
        iVar15 = (state->parse_state).mangled_idx;
        do {
          bVar13 = ParseCharClass(state,"OPRCGrVK");
        } while (bVar13);
        pcVar19 = state->mangled_begin;
        iVar7 = (state->parse_state).mangled_idx;
        bVar13 = ParseType(state);
        if (!bVar13) {
          pPVar1->mangled_idx = iVar6;
          pPVar1->out_cur_idx = iVar10;
          (state->parse_state).prev_name_idx = iVar11;
          *(undefined4 *)&(state->parse_state).field_0xc = uVar12;
          iVar15 = state->recursion_depth + -1;
          goto LAB_00105113;
        }
        for (pcVar19 = pcVar19 + iVar7; pcVar18 + iVar15 != pcVar19; pcVar19 = pcVar19 + -1) {
          bVar3 = pcVar19[-1];
          if (bVar3 < 0x4b) {
            if (bVar3 == 0x43) {
              str = " _Complex";
            }
            else {
              if (bVar3 != 0x47) goto switchD_00105065_caseD_4c;
              str = " _Imaginary";
            }
            goto switchD_00105065_caseD_50;
          }
          str = "*";
          switch(bVar3) {
          case 0x4b:
            str = " const";
            break;
          case 0x4c:
          case 0x4d:
          case 0x4e:
          case 0x51:
          case 0x53:
          case 0x54:
          case 0x55:
            goto switchD_00105065_caseD_4c;
          case 0x4f:
            str = "&&";
            break;
          case 0x50:
            break;
          case 0x52:
            str = "&";
            break;
          case 0x56:
            str = " volatile";
            break;
          default:
            if (bVar3 == 0x72) {
              str = " restrict";
              break;
            }
            goto switchD_00105065_caseD_4c;
          }
switchD_00105065_caseD_50:
          MaybeAppend(state,str);
switchD_00105065_caseD_4c:
        }
        state->recursion_depth = state->recursion_depth + -1;
        *(uint *)&(state->parse_state).field_0xc =
             *(uint *)&(state->parse_state).field_0xc & 0x8000ffff | uVar5 & 0x7fff0000;
        bVar13 = true;
        if (arity != (int *)0x0) {
          *arity = 1;
        }
      }
      else {
LAB_00105116:
        (state->parse_state).prev_name_idx = iVar16;
        pPVar1->mangled_idx = uVar8;
        pPVar1->out_cur_idx = uVar9;
        *(uint *)&(state->parse_state).field_0xc = uVar5;
        bVar13 = ParseTwoCharToken(state,"li");
        if (bVar13) {
          MaybeAppend(state,"operator\"\" ");
          bVar14 = ParseSourceName(state);
          bVar13 = true;
          if (bVar14) goto LAB_00105227;
        }
        (state->parse_state).prev_name_idx = iVar16;
        pPVar1->mangled_idx = uVar8;
        pPVar1->out_cur_idx = uVar9;
        *(uint *)&(state->parse_state).field_0xc = uVar5;
        bVar13 = ParseOneCharToken(state,'v');
        if (bVar13) {
          cVar4 = state->mangled_begin[(state->parse_state).mangled_idx];
          bVar13 = ParseCharClass(state,"0123456789");
          if (arity != (int *)0x0 && bVar13) {
            *arity = cVar4 + -0x30;
          }
          if (bVar13) {
            bVar14 = ParseSourceName(state);
            bVar13 = true;
            if (bVar14) goto LAB_00105227;
          }
        }
        (state->parse_state).prev_name_idx = iVar16;
        pPVar1->mangled_idx = uVar8;
        pPVar1->out_cur_idx = uVar9;
        *(uint *)&(state->parse_state).field_0xc = uVar5;
        lVar17 = (long)(state->parse_state).mangled_idx;
        cVar4 = state->mangled_begin[lVar17];
        if (((byte)(cVar4 + 0x9fU) < 0x1a) &&
           (bVar3 = state->mangled_begin[lVar17 + 1], (byte)((bVar3 & 0xdf) + 0xbf) < 0x1a)) {
          pcVar18 = "nw";
          puVar20 = (undefined8 *)(kOperatorList + 0x18);
          do {
            if ((cVar4 == *pcVar18) && (bVar3 == pcVar18[1])) {
              if (arity != (int *)0x0) {
                *arity = *(int *)(puVar20 + -1);
              }
              MaybeAppend(state,"operator");
              pcVar18 = (char *)puVar20[-2];
              if ((byte)(*pcVar18 + 0x9fU) < 0x1a) {
                MaybeAppend(state," ");
              }
              MaybeAppend(state,pcVar18);
              (state->parse_state).mangled_idx = (state->parse_state).mangled_idx + 2;
              bVar13 = true;
              goto LAB_00105227;
            }
            pcVar18 = (char *)*puVar20;
            puVar20 = puVar20 + 3;
          } while (pcVar18 != (char *)0x0);
        }
        bVar13 = false;
      }
LAB_00105227:
      iVar16 = state->recursion_depth + -1;
      goto LAB_001050f2;
    }
  }
  bVar13 = false;
LAB_001050f2:
  state->recursion_depth = iVar16;
  return bVar13;
}

Assistant:

static bool ParseOperatorName(State *state, int *arity) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  if (!AtLeastNumCharsRemaining(RemainingInput(state), 2)) {
    return false;
  }
  // First check with "cv" (cast) case.
  ParseState copy = state->parse_state;
  if (ParseTwoCharToken(state, "cv") && MaybeAppend(state, "operator ") &&
      EnterNestedName(state) && ParseConversionOperatorType(state) &&
      LeaveNestedName(state, copy.nest_level)) {
    if (arity != nullptr) {
      *arity = 1;
    }
    return true;
  }
  state->parse_state = copy;

  // Then user-defined literals.
  if (ParseTwoCharToken(state, "li") && MaybeAppend(state, "operator\"\" ") &&
      ParseSourceName(state)) {
    return true;
  }
  state->parse_state = copy;

  // Then vendor extended operators.
  if (ParseOneCharToken(state, 'v') && ParseDigit(state, arity) &&
      ParseSourceName(state)) {
    return true;
  }
  state->parse_state = copy;

  // Other operator names should start with a lower alphabet followed
  // by a lower/upper alphabet.
  if (!(IsLower(RemainingInput(state)[0]) &&
        IsAlpha(RemainingInput(state)[1]))) {
    return false;
  }
  // We may want to perform a binary search if we really need speed.
  const AbbrevPair *p;
  for (p = kOperatorList; p->abbrev != nullptr; ++p) {
    if (RemainingInput(state)[0] == p->abbrev[0] &&
        RemainingInput(state)[1] == p->abbrev[1]) {
      if (arity != nullptr) {
        *arity = p->arity;
      }
      MaybeAppend(state, "operator");
      if (IsLower(*p->real_name)) {  // new, delete, etc.
        MaybeAppend(state, " ");
      }
      MaybeAppend(state, p->real_name);
      state->parse_state.mangled_idx += 2;
      UpdateHighWaterMark(state);
      return true;
    }
  }
  return false;
}